

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall
nvim::Nvim::async_tabpage_set_var(Nvim *this,Tabpage tabpage,string *name,Object *value)

{
  allocator local_51;
  Tabpage local_50;
  string local_48;
  
  local_50 = tabpage;
  std::__cxx11::string::string((string *)&local_48,"nvim_tabpage_set_var",&local_51);
  NvimRPC::
  async_call<long,std::__cxx11::string,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>
            (&this->client_,&local_48,&local_50,name,value);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void Nvim::async_tabpage_set_var(Tabpage tabpage, const std::string& name, const Object& value) {
    client_.async_call("nvim_tabpage_set_var", tabpage, name, value);
}